

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

string * __thiscall
Json::writeString_abi_cxx11_(string *__return_storage_ptr__,Json *this,Factory *builder,Value *root)

{
  pointer pSVar1;
  unique_ptr<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_> local_1a0;
  StreamWriterPtr writer;
  ostringstream sout;
  Value *root_local;
  Factory *builder_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&writer);
  pSVar1 = (pointer)(**(code **)(*(long *)this + 0x10))();
  std::unique_ptr<Json::StreamWriter,std::default_delete<Json::StreamWriter>>::
  unique_ptr<std::default_delete<Json::StreamWriter>,void>
            ((unique_ptr<Json::StreamWriter,std::default_delete<Json::StreamWriter>> *)&local_1a0,
             pSVar1);
  pSVar1 = std::unique_ptr<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>::operator->
                     (&local_1a0);
  (*pSVar1->_vptr_StreamWriter[2])(pSVar1,builder,&writer);
  std::__cxx11::ostringstream::str();
  std::unique_ptr<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>::~unique_ptr
            (&local_1a0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&writer);
  return __return_storage_ptr__;
}

Assistant:

JSONCPP_STRING writeString(StreamWriter::Factory const& builder, Value const& root) {
  JSONCPP_OSTRINGSTREAM sout;
  StreamWriterPtr const writer(builder.newStreamWriter());
  writer->write(root, &sout);
  return sout.str();
}